

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O0

void boost::python::detail::
     def_init_aux<boost::python::class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector4<HighFreqDataType,int,HFParsingInfo,int>,boost::mpl::size<boost::mpl::vector4<HighFreqDataType,int,HFParsingInfo,int>>>
               (size<boost::mpl::vector4<HighFreqDataType,_int,_HFParsingInfo,_int>_> *param_1,
               char *param_2,object *param_3,char **param_4)

{
  value_holder<SpikesConsumer_python> *in_stack_ffffffffffffffb8;
  keyword_range *in_stack_ffffffffffffffc0;
  default_call_policies *in_stack_ffffffffffffffc8;
  
  make_keyword_range_constructor<boost::mpl::vector4<HighFreqDataType,int,HFParsingInfo,int>,boost::mpl::size<boost::mpl::vector4<HighFreqDataType,int,HFParsingInfo,int>>,boost::python::objects::value_holder<SpikesConsumer_python>,boost::python::default_call_policies>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (vector4<HighFreqDataType,_int,_HFParsingInfo,_int> *)&stack0xffffffffffffffc8,param_1)
  ;
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::def<boost::python::api::object,char_const*>
            ((class_<SpikesConsumer_python,_boost::python::bases<HFSubConsumer_python,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>,_boost::noncopyable_::noncopyable,_boost::python::detail::not_specified>
              *)param_1,param_2,param_3,param_4);
  api::object::~object((object *)0x3cc2c0);
  return;
}

Assistant:

inline void def_init_aux(
      ClassT& cl
      , Signature const&
      , NArgs
      , CallPoliciesT const& policies
      , char const* doc
      , detail::keyword_range const& keywords_
      )
  {
      cl.def(
          "__init__"
        , detail::make_keyword_range_constructor<Signature,NArgs>(
              policies
            , keywords_
            , (typename ClassT::metadata::holder*)0
          )
        , doc
      );
  }